

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O0

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *
s2coding::ConvertCellsToValues
          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__return_storage_ptr__,
          vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> *cell_points,int level,
          bool *have_exceptions)

{
  bool bVar1;
  int n;
  size_type __n;
  reference pCVar2;
  uint64 uVar3;
  uint64 uVar4;
  ostream *poVar5;
  S2LogMessage local_90;
  S2LogMessageVoidify local_79;
  uint64 local_78;
  uint64 v;
  uint local_68;
  uint32 tj;
  uint32 sj;
  CellPoint cp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> *__range1;
  int shift;
  bool *have_exceptions_local;
  int level_local;
  vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> *cell_points_local;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *values;
  
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (__return_storage_ptr__);
  __n = std::vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>::size(cell_points);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::reserve
            (__return_storage_ptr__,__n);
  *have_exceptions = false;
  __range1._0_1_ = -(char)level + 0x1e;
  __end1 = std::vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>::begin
                     (cell_points);
  cp._4_8_ = std::vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>::end
                       (cell_points);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_s2coding::CellPoint_*,_std::vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>_>
                                *)&cp.si);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    pCVar2 = __gnu_cxx::
             __normal_iterator<const_s2coding::CellPoint_*,_std::vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>_>
             ::operator*(&__end1);
    tj._0_1_ = pCVar2->level;
    tj._1_1_ = pCVar2->face;
    tj._2_2_ = *(undefined2 *)&pCVar2->field_0x2;
    unique0x00012004 = pCVar2->si;
    cp._0_4_ = pCVar2->ti;
    if ((char)(undefined1)tj == level) {
      local_68 = ((uint)(byte)tj._1_1_ << 0x1e | (uint)unique0x00012004 >> 1) >>
                 ((byte)__range1 & 0x1f);
      v._4_4_ = (((byte)tj._1_1_ & 4) << 0x1d | cp._0_4_) >> (-(char)level + 0x1fU & 0x1f);
      uVar3 = InterleaveUint32BitPairs(local_68,v._4_4_);
      local_78 = uVar3;
      n = MaxBitsForLevel(level);
      uVar4 = BitMask(n);
      if (uVar4 < uVar3) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_90,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                   ,0x24f,kFatal,(ostream *)&std::cerr);
        poVar5 = S2LogMessage::stream(&local_90);
        poVar5 = std::operator<<(poVar5,"Check failed: (v) <= (BitMask(MaxBitsForLevel(level))) ");
        S2LogMessageVoidify::operator&(&local_79,poVar5);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_90);
      }
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (__return_storage_ptr__,&local_78);
    }
    else {
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
                (__return_storage_ptr__,&kException);
      *have_exceptions = true;
    }
    __gnu_cxx::
    __normal_iterator<const_s2coding::CellPoint_*,_std::vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

vector<uint64> ConvertCellsToValues(const vector<CellPoint>& cell_points,
                                    int level, bool* have_exceptions) {
  vector<uint64> values;
  values.reserve(cell_points.size());
  *have_exceptions = false;
  int shift = S2CellId::kMaxLevel - level;
  for (CellPoint cp : cell_points) {
    if (cp.level != level) {
      values.push_back(kException);
      *have_exceptions = true;
    } else {
      // Note that bit 31 of tj is always zero, and that bits are interleaved in
      // such a way that bit 63 of the result is always zero.
      //
      // The S2CellId version of the following code is:
      // uint64 v = S2CellId::FromFaceIJ(cp.face, cp.si >> 1, cp.ti >> 1).
      //            parent(level).id() >> (2 * shift + 1);
      uint32 sj = (((cp.face & 3) << 30) | (cp.si >> 1)) >> shift;
      uint32 tj = (((cp.face & 4) << 29) | cp.ti) >> (shift + 1);
      uint64 v = InterleaveUint32BitPairs(sj, tj);
      S2_DCHECK_LE(v, BitMask(MaxBitsForLevel(level)));
      values.push_back(v);
    }
  }
  return values;
}